

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::__cxx11::string>>
::_find_key<std::__cxx11::string>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          size_t hashval)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  pointer __s2;
  size_t __n;
  uint uVar5;
  ushort uVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  __m128i match;
  char cVar28;
  char cVar31;
  char cVar32;
  char cVar33;
  
  lVar2 = *(long *)this;
  if (lVar2 != 0) {
    uVar3 = *(ulong *)(this + 0x18);
    if ((uVar3 + 1 & uVar3) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar25 = hashval >> 7;
    auVar29 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar29 = pshuflw(auVar29,auVar29,0);
    lVar4 = *(long *)(this + 8);
    __s2 = (key->_M_dataplus)._M_p;
    __n = key->_M_string_length;
    lVar26 = 0;
    while( true ) {
      uVar25 = uVar25 & uVar3;
      pcVar1 = (char *)(lVar2 + uVar25);
      cVar7 = *pcVar1;
      cVar8 = pcVar1[1];
      cVar9 = pcVar1[2];
      cVar10 = pcVar1[3];
      cVar11 = pcVar1[4];
      cVar12 = pcVar1[5];
      cVar13 = pcVar1[6];
      cVar14 = pcVar1[7];
      cVar15 = pcVar1[8];
      cVar16 = pcVar1[9];
      cVar17 = pcVar1[10];
      cVar18 = pcVar1[0xb];
      cVar19 = pcVar1[0xc];
      cVar20 = pcVar1[0xd];
      cVar21 = pcVar1[0xe];
      cVar22 = pcVar1[0xf];
      cVar28 = auVar29[0];
      auVar30[0] = -(cVar28 == cVar7);
      cVar31 = auVar29[1];
      auVar30[1] = -(cVar31 == cVar8);
      cVar32 = auVar29[2];
      auVar30[2] = -(cVar32 == cVar9);
      cVar33 = auVar29[3];
      auVar30[3] = -(cVar33 == cVar10);
      auVar30[4] = -(cVar28 == cVar11);
      auVar30[5] = -(cVar31 == cVar12);
      auVar30[6] = -(cVar32 == cVar13);
      auVar30[7] = -(cVar33 == cVar14);
      auVar30[8] = -(cVar28 == cVar15);
      auVar30[9] = -(cVar31 == cVar16);
      auVar30[10] = -(cVar32 == cVar17);
      auVar30[0xb] = -(cVar33 == cVar18);
      auVar30[0xc] = -(cVar28 == cVar19);
      auVar30[0xd] = -(cVar31 == cVar20);
      auVar30[0xe] = -(cVar32 == cVar21);
      auVar30[0xf] = -(cVar33 == cVar22);
      uVar6 = (ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe | (ushort)(auVar30[0xf] >> 7) << 0xf;
      if (uVar6 != 0) {
        uVar24 = (uint)uVar6;
        do {
          uVar5 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
            }
          }
          uVar27 = uVar5 + uVar25 & uVar3;
          if (*(size_t *)(lVar4 + 8 + uVar27 * 0x20) == __n) {
            if (__n == 0) {
              return uVar27;
            }
            iVar23 = bcmp(*(void **)(uVar27 * 0x20 + lVar4),__s2,__n);
            if (iVar23 == 0) {
              return uVar27;
            }
          }
          uVar24 = uVar24 - 1 & uVar24;
        } while (uVar24 != 0);
      }
      auVar34[0] = -(cVar7 == -0x80);
      auVar34[1] = -(cVar8 == -0x80);
      auVar34[2] = -(cVar9 == -0x80);
      auVar34[3] = -(cVar10 == -0x80);
      auVar34[4] = -(cVar11 == -0x80);
      auVar34[5] = -(cVar12 == -0x80);
      auVar34[6] = -(cVar13 == -0x80);
      auVar34[7] = -(cVar14 == -0x80);
      auVar34[8] = -(cVar15 == -0x80);
      auVar34[9] = -(cVar16 == -0x80);
      auVar34[10] = -(cVar17 == -0x80);
      auVar34[0xb] = -(cVar18 == -0x80);
      auVar34[0xc] = -(cVar19 == -0x80);
      auVar34[0xd] = -(cVar20 == -0x80);
      auVar34[0xe] = -(cVar21 == -0x80);
      auVar34[0xf] = -(cVar22 == -0x80);
      if ((((((((((((((((auVar34 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar34 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar34 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar34 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar34 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar34 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar34 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar34 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar34 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar34 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar34 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar34 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar22 == -0x80)
      break;
      uVar25 = uVar25 + lVar26 + 0x10;
      lVar26 = lVar26 + 0x10;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t _find_key(const K& PHMAP_RESTRICT key, size_t hashval) {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return (size_t)-1;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                                          EqualElement<K>{key, eq_ref()},
                                          PolicyTraits::element(slots_ + seq.offset((size_t)i)))))
                    return seq.offset((size_t)i);
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
            seq.next();
        }
        return (size_t)-1;
    }